

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atkdp.cpp
# Opt level: O2

void anothersearch(int bomberNum,int bomberID,_func_void_BelongStructure_ptr_float_int_ptr *func)

{
  int iVar1;
  __type_conflict _Var2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  float fVar9;
  
  lVar4 = (long)usedGrid[0];
  lVar5 = (long)usedGrid[1];
  lVar6 = (long)usedGrid[2];
  lVar7 = (long)usedGrid[3];
  fVar9 = formularAllShipAtk(shipAtk);
  (*func)(dpRes[lVar4][lVar5][lVar6] + lVar7,fVar9,belonging);
  if (bomberNum != 0) {
    if (bomberID < 1) {
      lVar4 = 0;
    }
    else {
      _Var2 = std::operator==(&planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                               super__Vector_impl_data._M_start[(uint)bomberID].name,
                              &planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                               super__Vector_impl_data._M_start[bomberID - 1U].name);
      if (_Var2) {
        lVar4 = (long)belonging[bomberID - 1U];
      }
      else {
        lVar4 = 0;
      }
    }
    iVar8 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
            super__Vector_impl_data._M_start[bomberID].torpedoAtk * 10 +
            planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
            super__Vector_impl_data._M_start[bomberID].bombAtk * 0xd;
    iVar1 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
            super__Vector_impl_data._M_start[bomberID].accuracy;
    iVar3 = carrierNum;
    for (; lVar4 < iVar3; lVar4 = lVar4 + 1) {
      if (usedGrid[lVar4] < availGrid[lVar4]) {
        shipAtk[lVar4] = shipAtk[lVar4] + iVar8;
        shipAccu[lVar4] = shipAccu[lVar4] + iVar1;
        usedGrid[lVar4] = usedGrid[lVar4] + 1;
        belonging[bomberID] = (int)lVar4;
        anothersearch(bomberNum + -1,bomberID + 1,func);
        usedGrid[lVar4] = usedGrid[lVar4] + -1;
        shipAccu[lVar4] = shipAccu[lVar4] - iVar1;
        shipAtk[lVar4] = shipAtk[lVar4] - iVar8;
        iVar3 = carrierNum;
      }
    }
  }
  return;
}

Assistant:

void anothersearch(int bomberNum,int bomberID,void(* func)(BelongStructure *,float ,int *)){
    func(&dpRes[usedGrid[0]][usedGrid[1]][usedGrid[2]][usedGrid[3]],formularAllShipAtk(shipAtk),belonging);
    if(bomberNum == 0){//��������
        return;
    }

    int i=0;
    //���������������ظ���
    if(bomberID > 0 && planeVecA[bomberID].name == planeVecA[bomberID - 1].name)
        i = belonging[bomberID - 1];
    Plane &tplane = planeVecA[bomberID];
    int tdamage = formulaDamage(tplane), taccu = tplane.accuracy;
    for(; i < carrierNum; i++){
        if(usedGrid[i]<availGrid[i]){
            shipAtk[i] += tdamage;
            shipAccu[i] += taccu;
            usedGrid[i] ++ ;
            belonging[bomberID] = i;
            anothersearch(bomberNum - 1,bomberID + 1,func);
            usedGrid[i] -- ;
            shipAccu[i] -= taccu;
            shipAtk[i] -= tdamage;
        }
    }
}